

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O3

Aig_Man_t * Dar_ManCompress(Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fPower,int fVerbose)

{
  Aig_Man_t *pAVar1;
  Aig_Man_t *pAVar2;
  Dar_RefPar_t ParsRef;
  Dar_RwrPar_t ParsRwr;
  Dar_RefPar_t local_74;
  Dar_RwrPar_t local_54;
  
  Dar_ManDefaultRwrParams(&local_54);
  Dar_ManDefaultRefParams(&local_74);
  local_54.fVerbose = 0;
  local_74.fVerbose = 0;
  local_74.fUpdateLevel = fUpdateLevel;
  local_54.fUpdateLevel = fUpdateLevel;
  local_54.fPower = fPower;
  pAVar1 = Aig_ManDupDfs(pAig);
  if (fVerbose != 0) {
    printf("Starting:  ");
    Aig_ManPrintStats(pAVar1);
  }
  Dar_ManRewrite(pAVar1,&local_54);
  pAVar2 = Aig_ManDupDfs(pAVar1);
  Aig_ManStop(pAVar1);
  if (fVerbose != 0) {
    printf("Rewrite:   ");
    Aig_ManPrintStats(pAVar2);
  }
  Dar_ManRefactor(pAVar2,&local_74);
  pAVar1 = Aig_ManDupDfs(pAVar2);
  Aig_ManStop(pAVar2);
  if (fVerbose != 0) {
    printf("Refactor:  ");
    Aig_ManPrintStats(pAVar1);
  }
  pAVar2 = pAVar1;
  if (fBalance != 0) {
    pAVar2 = Dar_ManBalance(pAVar1,fUpdateLevel);
    Aig_ManStop(pAVar1);
    if (fVerbose != 0) {
      printf("Balance:   ");
      Aig_ManPrintStats(pAVar2);
    }
  }
  local_54.fUseZeros = 1;
  local_74.fUseZeros = 1;
  Dar_ManRewrite(pAVar2,&local_54);
  pAVar1 = Aig_ManDupDfs(pAVar2);
  Aig_ManStop(pAVar2);
  if (fVerbose != 0) {
    printf("RewriteZ:  ");
    Aig_ManPrintStats(pAVar1);
  }
  return pAVar1;
}

Assistant:

Aig_Man_t * Dar_ManCompress( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fPower, int fVerbose )
//alias compress2   "b -l; rw -l; rwz -l; b -l; rwz -l; b -l"
{
    Aig_Man_t * pTemp;

    Dar_RwrPar_t ParsRwr, * pParsRwr = &ParsRwr;
    Dar_RefPar_t ParsRef, * pParsRef = &ParsRef;

    Dar_ManDefaultRwrParams( pParsRwr );
    Dar_ManDefaultRefParams( pParsRef );

    pParsRwr->fUpdateLevel = fUpdateLevel;
    pParsRef->fUpdateLevel = fUpdateLevel;

    pParsRwr->fPower = fPower;

    pParsRwr->fVerbose = 0;//fVerbose;
    pParsRef->fVerbose = 0;//fVerbose;

    pAig = Aig_ManDupDfs( pAig ); 
    if ( fVerbose ) printf( "Starting:  " ), Aig_ManPrintStats( pAig );
/*
    // balance
    if ( fBalance )
    {
    pAig = Dar_ManBalance( pTemp = pAig, fUpdateLevel );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    }
*/    
    // rewrite
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Rewrite:   " ), Aig_ManPrintStats( pAig );
    
    // refactor
    Dar_ManRefactor( pAig, pParsRef );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Refactor:  " ), Aig_ManPrintStats( pAig );

    // balance
    if ( fBalance )
    {
    pAig = Dar_ManBalance( pTemp = pAig, fUpdateLevel );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    }

    pParsRwr->fUseZeros = 1;
    pParsRef->fUseZeros = 1;
    
    // rewrite
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "RewriteZ:  " ), Aig_ManPrintStats( pAig );

    return pAig;
}